

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool __thiscall ON_BoundingBox::Transform(ON_BoundingBox *this,ON_Xform *xform)

{
  bool bVar1;
  ON_3dPointArray corners;
  ON_SimpleArray<ON_3dPoint> local_30;
  
  ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_30);
  bVar1 = GetCorners(this,(ON_3dPointArray *)&local_30);
  if (bVar1) {
    bVar1 = ON_3dPointArray::Transform((ON_3dPointArray *)&local_30,xform);
    if (bVar1) {
      bVar1 = Set(this,&local_30,0);
      goto LAB_00405879;
    }
  }
  bVar1 = false;
LAB_00405879:
  ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_30);
  return bVar1;
}

Assistant:

bool ON_BoundingBox::Transform( const ON_Xform& xform )
{
  ON_3dPointArray corners;
  bool rc =  GetCorners( corners );
  if (rc) {
    rc = corners.Transform(xform);
    if (rc)
      rc = Set(corners);
  }
  return rc;
}